

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

void __thiscall QNetworkAccessManager::~QNetworkAccessManager(QNetworkAccessManager *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QNetworkReply_*> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_002c9920;
  if (*(long **)(*(long *)(this + 8) + 0x98) != (long *)0x0) {
    (**(code **)(**(long **)(*(long *)(this + 8) + 0x98) + 8))();
  }
  QObject::findChildren<QNetworkReply*>
            ((QList<QNetworkReply_*> *)&local_30,(QObject *)this,(FindChildOptions)0x1);
  qDeleteAll<QList<QNetworkReply*>>((QList<QNetworkReply_*> *)&local_30);
  QArrayDataPointer<QNetworkReply_*>::~QArrayDataPointer(&local_30);
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessManager::~QNetworkAccessManager()
{
#ifndef QT_NO_NETWORKPROXY
    delete d_func()->proxyFactory;
#endif

    // Delete the QNetworkReply children first.
    // Else a QAbstractNetworkCache might get deleted in ~QObject
    // before a QNetworkReply that accesses the QAbstractNetworkCache
    // object in its destructor.
    qDeleteAll(findChildren<QNetworkReply *>());
    // The other children will be deleted in this ~QObject
    // FIXME instead of this "hack" make the QNetworkReplyImpl
    // properly watch the cache deletion, e.g. via a QWeakPointer.
}